

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

Node * __thiscall
p2t::Sweep::NewFrontTriangle(Sweep *this,SweepContext *tcx,Point *point,Node *node)

{
  bool bVar1;
  Triangle *this_00;
  Node *new_node;
  
  this_00 = (Triangle *)operator_new(0x40);
  Triangle::Triangle(this_00,point,node->point,node->next->point);
  Triangle::MarkNeighbor(this_00,node->triangle);
  SweepContext::AddToMap(tcx,this_00);
  new_node = (Node *)operator_new(0x28);
  new_node->point = point;
  new_node->triangle = (Triangle *)0x0;
  new_node->next = (Node *)0x0;
  new_node->prev = (Node *)0x0;
  new_node->value = point->x;
  std::vector<p2t::Node_*,_std::allocator<p2t::Node_*>_>::push_back(&this->nodes_,&new_node);
  new_node->next = node->next;
  new_node->prev = node;
  node->next->prev = new_node;
  node->next = new_node;
  bVar1 = Legalize(this,tcx,this_00);
  if (!bVar1) {
    SweepContext::MapTriangleToNodes(tcx,this_00);
  }
  return new_node;
}

Assistant:

Node& Sweep::NewFrontTriangle(SweepContext& tcx, Point& point, Node& node)
{
  Triangle* triangle = new Triangle(point, *node.point, *node.next->point);

  triangle->MarkNeighbor(*node.triangle);
  tcx.AddToMap(triangle);

  Node* new_node = new Node(point);
  nodes_.push_back(new_node);

  new_node->next = node.next;
  new_node->prev = &node;
  node.next->prev = new_node;
  node.next = new_node;

  if (!Legalize(tcx, *triangle)) {
    tcx.MapTriangleToNodes(*triangle);
  }

  return *new_node;
}